

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

token * __thiscall mjs::token::operator=(token *this,token *t)

{
  if (this != t) {
    destroy(this);
    this->type_ = t->type_;
    if ((t->type_ == string_literal) || (t->type_ == identifier)) {
      (this->field_1).ivalue_ = (uint64_t)((long)&this->field_1 + 0x10);
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&this->field_1,(t->field_1).ivalue_,
                 (t->field_1).ivalue_ + (t->field_1).text_._M_string_length * 4);
    }
    else {
      (this->field_1).ivalue_ = (t->field_1).ivalue_;
    }
  }
  return this;
}

Assistant:

token& operator=(const token& t) {
        if (this != &t) {
            destroy();
            type_ = t.type_;
            if (t.has_text()) {
                new (&text_) std::wstring(t.text_);
            } else {
                ivalue_ = t.ivalue_;
            }
        }
        return *this;
    }